

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.cpp
# Opt level: O2

void __thiscall CVmObjPattern::notify_delete(CVmObjPattern *this,int in_root_set)

{
  char *pcVar1;
  re_compiled_pattern *pattern;
  
  pcVar1 = (this->super_CVmObject).ext_;
  if (pcVar1 != (char *)0x0) {
    pattern = *(re_compiled_pattern **)pcVar1;
    if (pattern != (re_compiled_pattern *)0x0) {
      CRegexParser::free_pattern(pattern);
    }
    if (in_root_set == 0) {
      (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])(G_mem_X->varheap_,(this->super_CVmObject).ext_);
      return;
    }
  }
  return;
}

Assistant:

void CVmObjPattern::notify_delete(VMG_ int in_root_set)
{
    /* free my extension data */
    if (ext_ != 0)
    {
        /* 
         *   Free my pattern, if I've compiled it.  (Note that we must not
         *   call get_pattern() here, because doing so would unnecessarily
         *   create a pattern if we haven't already done so - that would be
         *   stupid, because the only reason we're asking for it is so that
         *   we can delete it.)  
         */
        if (get_ext()->pat != 0)
            CRegexParser::free_pattern(get_ext()->pat);

        /* free the extension */
        if (!in_root_set)
            G_mem->get_var_heap()->free_mem(ext_);
    }
}